

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# battlesystem.cpp
# Opt level: O0

int battle(warrior *Warrior,zombie *Zombie)

{
  code *pcVar1;
  zombie *this;
  bool bVar2;
  int iVar3;
  warriorTypes wVar4;
  ostream *poVar5;
  byte local_22;
  char local_21;
  zombie *pzStack_20;
  char selection;
  zombie *Zombie_local;
  warrior *Warrior_local;
  
  pzStack_20 = Zombie;
  Zombie_local = (zombie *)Warrior;
  printMessage();
  while( true ) {
    bVar2 = warrior::isAlive((warrior *)Zombie_local);
    local_22 = 0;
    if (bVar2) {
      bVar2 = zombie::isKO(pzStack_20);
      local_22 = bVar2 ^ 0xff;
    }
    if ((local_22 & 1) == 0) break;
    (*(code *)**(undefined8 **)&Zombie_local->super_entity)();
    zombie::printInfo(pzStack_20,1);
    (**(code **)(*(long *)&Zombie_local->super_entity + 8))();
    std::operator>>((istream *)&std::cin,&local_21);
    playerAttack(local_21,(warrior *)Zombie_local,pzStack_20);
    bVar2 = zombie::isKO(pzStack_20);
    if (bVar2) break;
    zombie::printInfo(pzStack_20,2);
    this = Zombie_local;
    iVar3 = zombie::getDmg(pzStack_20);
    warrior::takeDamage((warrior *)this,iVar3);
  }
  bVar2 = zombie::isKO(pzStack_20);
  if (bVar2) {
    zombie::printInfo(pzStack_20,3);
    (**(code **)(*(long *)&Zombie_local->super_entity + 0x20))(Zombie_local,pzStack_20);
    poVar5 = std::operator<<((ostream *)&std::cout,"Score: ");
    iVar3 = warrior::getScore((warrior *)Zombie_local);
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,iVar3);
    std::operator<<(poVar5,"\n");
    Warrior_local._4_4_ = 0;
  }
  else {
    bVar2 = warrior::isAlive((warrior *)Zombie_local);
    if (bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    wVar4 = warrior::getWarriorType((warrior *)Zombie_local);
    if (wVar4 == CHICHONNE) {
      std::operator<<((ostream *)&std::cout,"Chichonne ");
    }
    else {
      std::operator<<((ostream *)&std::cout,"Derek ");
    }
    std::operator<<((ostream *)&std::cout,"Has Been Defeated!\n");
    Warrior_local._4_4_ = 1;
  }
  return Warrior_local._4_4_;
}

Assistant:

int battle(warrior *Warrior, zombie *Zombie) {
    //function to perform the battle gameplay
    //returns 0 if player wins
    //returns 1 if zombie wins

    char selection;
    printMessage();
    while (Warrior->isAlive() && !Zombie->isKO()) {
        Warrior->verbosePrint();
        Zombie->printInfo(1);
        Warrior->printOptions();
        cin >> selection;
        playerAttack(selection, Warrior, Zombie);
        if (Zombie->isKO())
            break;
        Zombie->printInfo(2);
        Warrior->takeDamage(Zombie->getDmg());
    }
    if (Zombie->isKO()) {
        Zombie->printInfo(3);
        Warrior->addKill(Zombie);
        cout << "Score: " << Warrior->getScore() << "\n";
        return 0;
    }
    if (!Warrior->isAlive()) {
        (Warrior->getWarriorType() == CHICHONNE) ? cout << "Chichonne " : cout << "Derek ";
        cout << "Has Been Defeated!\n";
        return 1;
    }
}